

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

mt19937 * Population::random_engine(void)

{
  int iVar1;
  uint uVar2;
  
  if (random_engine()::random_device == '\0') {
    iVar1 = __cxa_guard_acquire(&random_engine()::random_device);
    if (iVar1 != 0) {
      std::random_device::random_device(&random_engine::random_device);
      __cxa_atexit(std::random_device::~random_device,&random_engine::random_device,&__dso_handle);
      __cxa_guard_release(&random_engine()::random_device);
    }
  }
  if (random_engine()::smt == '\0') {
    iVar1 = __cxa_guard_acquire(&random_engine()::smt);
    if (iVar1 != 0) {
      uVar2 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&random_engine::smt,(ulong)uVar2);
      __cxa_guard_release(&random_engine()::smt);
    }
  }
  return &random_engine::smt;
}

Assistant:

std::mt19937& Population::random_engine() {
    static std::random_device random_device;
    static std::mt19937 smt(random_device());
    return smt;
}